

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * ImageCopy(Image image)

{
  int iVar1;
  void *pvVar2;
  Image *in_RDI;
  void *in_stack_00000008;
  int local_18;
  int local_14;
  int i;
  int size;
  int height;
  int width;
  
  memset(in_RDI,0,0x18);
  size = (int)image.data;
  i = image.data._4_4_;
  local_14 = 0;
  for (local_18 = 0; local_18 < image.width; local_18 = local_18 + 1) {
    iVar1 = GetPixelDataSize(size,i,image.height);
    local_14 = iVar1 + local_14;
    size = size / 2;
    i = i / 2;
    if (size < 1) {
      size = 1;
    }
    if (i < 1) {
      i = 1;
    }
  }
  pvVar2 = malloc((long)local_14);
  in_RDI->data = pvVar2;
  if (in_RDI->data != (void *)0x0) {
    memcpy(in_RDI->data,in_stack_00000008,(long)local_14);
    in_RDI->width = (int)image.data;
    in_RDI->height = image.data._4_4_;
    in_RDI->mipmaps = image.width;
    in_RDI->format = image.height;
  }
  return in_RDI;
}

Assistant:

Image ImageCopy(Image image)
{
    Image newImage = { 0 };

    int width = image.width;
    int height = image.height;
    int size = 0;

    for (int i = 0; i < image.mipmaps; i++)
    {
        size += GetPixelDataSize(width, height, image.format);

        width /= 2;
        height /= 2;

        // Security check for NPOT textures
        if (width < 1) width = 1;
        if (height < 1) height = 1;
    }

    newImage.data = RL_MALLOC(size);

    if (newImage.data != NULL)
    {
        // NOTE: Size must be provided in bytes
        memcpy(newImage.data, image.data, size);

        newImage.width = image.width;
        newImage.height = image.height;
        newImage.mipmaps = image.mipmaps;
        newImage.format = image.format;
    }

    return newImage;
}